

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O1

void __thiscall
icu_63::WholeStringBreakIterator::setText
          (WholeStringBreakIterator *this,UText *text,UErrorCode *errorCode)

{
  int64_t iVar1;
  
  if (U_ZERO_ERROR < *errorCode) {
    return;
  }
  iVar1 = utext_nativeLength_63(text);
  if (iVar1 < 0x80000000) {
    *(int *)&(this->super_BreakIterator).field_0x144 = (int)iVar1;
  }
  else {
    *errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
  }
  return;
}

Assistant:

static
    inline UBool U_SUCCESS(UErrorCode code) { return (UBool)(code<=U_ZERO_ERROR); }